

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

int raviX_bitset_equal_p(BitSet *bm1,BitSet *bm2)

{
  bitset_el_t *pbVar1;
  int iVar2;
  bitset_el_t *addr2;
  bitset_el_t *addr1;
  size_t bm2_len;
  size_t bm1_len;
  size_t temp_len;
  size_t i;
  BitSet *temp_bm;
  BitSet *bm2_local;
  BitSet *bm1_local;
  
  bm2_len = bm1->els_num;
  pbVar1 = (bitset_el_t *)bm2->els_num;
  addr1 = pbVar1;
  temp_bm = bm2;
  bm2_local = bm1;
  if (pbVar1 < bm2_len) {
    addr1 = (bitset_el_t *)bm2_len;
    bm2_len = (size_t)pbVar1;
    temp_bm = bm1;
    bm2_local = bm2;
  }
  pbVar1 = temp_bm->varr;
  iVar2 = memcmp(bm2_local->varr,pbVar1,bm2_len << 3);
  if (iVar2 == 0) {
    for (temp_len = bm2_len; temp_len < addr1; temp_len = temp_len + 1) {
      if (pbVar1[temp_len] != 0) {
        return 0;
      }
    }
    bm1_local._4_4_ = 1;
  }
  else {
    bm1_local._4_4_ = 0;
  }
  return bm1_local._4_4_;
}

Assistant:

int raviX_bitset_equal_p(const BitSet * bm1, const BitSet * bm2) {
	const BitSet * temp_bm;
	size_t i, temp_len, bm1_len = bm1->els_num;
	size_t bm2_len = bm2->els_num;
	bitset_el_t *addr1, *addr2;

	if (bm1_len > bm2_len) {
		temp_bm = bm1;
		bm1 = bm2;
		bm2 = temp_bm;
		temp_len = bm1_len;
		bm1_len = bm2_len;
		bm2_len = temp_len;
	}
	addr1 = bm1->varr;
	addr2 = bm2->varr;
	if (memcmp (addr1, addr2, bm1_len * sizeof (bitset_el_t)) != 0) return false;
	for (i = bm1_len; i < bm2_len; i++)
		if (addr2[i] != 0) return false;
	return true;
}